

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

int __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveSparse(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *feastol)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  pointer pnVar5;
  int *piVar6;
  undefined8 uVar7;
  type_conflict5 tVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  pointer local_1e0;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1d8;
  cpp_dec_float<100U,_int,_void> *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  devexpr local_88 [8];
  uint auStack_80 [2];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  
  local_238.m_backend.data._M_elems[0xc] = 0;
  local_238.m_backend.data._M_elems[0xd] = 0;
  local_238.m_backend.data._M_elems._56_5_ = 0;
  local_238.m_backend.data._M_elems[8] = 0;
  local_238.m_backend.data._M_elems[9] = 0;
  local_238.m_backend.data._M_elems[10] = 0;
  local_238.m_backend.data._M_elems[0xb] = 0;
  local_238.m_backend.data._M_elems[4] = 0;
  local_238.m_backend.data._M_elems[5] = 0;
  local_238.m_backend.data._M_elems[6] = 0;
  local_238.m_backend.data._M_elems[7] = 0;
  local_238.m_backend.data._M_elems[0] = 0;
  local_238.m_backend.data._M_elems[1] = 0;
  local_238.m_backend.data._M_elems[2] = 0;
  local_238.m_backend.data._M_elems[3] = 0;
  local_238.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_238.m_backend.exp = 0;
  local_238.m_backend.neg = false;
  local_238.m_backend.prec_elem = 0x10;
  pSVar4 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar5 = (pSVar4->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1e0 = (pSVar4->coWeights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_178,0,(type *)0x0);
  uVar11 = (ulong)(uint)(((this->
                          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesolver)->infeasibilities).super_IdxSet.num;
  local_1d0 = &(this->last).m_backend;
  local_1d8 = this;
  iVar9 = -1;
LAB_00363676:
  uVar10 = uVar11 & 0xffffffff;
  do {
    uVar11 = uVar11 - 1;
    if ((int)uVar10 < 1) {
      return iVar9;
    }
    iVar2 = (((local_1d8->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->infeasibilities).super_IdxSet.idx[uVar11];
    local_238.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
    local_238.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
    local_238.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_238.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x20);
    local_238.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_238.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x30);
    local_238.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar7 = *(undefined8 *)(puVar1 + 2);
    local_238.m_backend.data._M_elems._56_5_ = SUB85(uVar7,0);
    local_238.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_238.m_backend.exp = pnVar5[iVar2].m_backend.exp;
    local_238.m_backend.neg = pnVar5[iVar2].m_backend.neg;
    local_238.m_backend.fpclass = pnVar5[iVar2].m_backend.fpclass;
    local_238.m_backend.prec_elem = pnVar5[iVar2].m_backend.prec_elem;
    result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
    result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
    result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
    result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
    result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
    result.m_backend.data._M_elems._40_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 10)
    ;
    result.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
    result.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar8 = boost::multiprecision::operator<(&local_238,&result);
    if (tVar8) {
      uStack_50 = CONCAT35(local_238.m_backend.data._M_elems[0xf]._1_3_,
                           local_238.m_backend.data._M_elems._56_5_);
      local_88 = (devexpr  [8])local_238.m_backend.data._M_elems._0_8_;
      auStack_80[0] = local_238.m_backend.data._M_elems[2];
      auStack_80[1] = local_238.m_backend.data._M_elems[3];
      local_78[0] = local_238.m_backend.data._M_elems[4];
      local_78[1] = local_238.m_backend.data._M_elems[5];
      auStack_70[0] = local_238.m_backend.data._M_elems[6];
      auStack_70[1] = local_238.m_backend.data._M_elems[7];
      local_68[0] = local_238.m_backend.data._M_elems[8];
      local_68[1] = local_238.m_backend.data._M_elems[9];
      auStack_60[0] = local_238.m_backend.data._M_elems[10];
      auStack_60[1] = local_238.m_backend.data._M_elems[0xb];
      local_58[0] = local_238.m_backend.data._M_elems[0xc];
      local_58[1] = local_238.m_backend.data._M_elems[0xd];
      local_48 = local_238.m_backend.exp;
      local_44 = local_238.m_backend.neg;
      local_40 = local_238.m_backend.fpclass;
      iStack_3c = local_238.m_backend.prec_elem;
      local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_1e0[iVar2].m_backend.data;
      local_d8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&local_1e0[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&local_1e0[iVar2].m_backend.data + 0x10);
      local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&local_1e0[iVar2].m_backend.data + 0x20);
      local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&local_1e0[iVar2].m_backend.data + 0x30);
      local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_d8.m_backend.exp = local_1e0[iVar2].m_backend.exp;
      local_d8.m_backend.neg = local_1e0[iVar2].m_backend.neg;
      local_d8.m_backend.fpclass = local_1e0[iVar2].m_backend.fpclass;
      local_d8.m_backend.prec_elem = local_1e0[iVar2].m_backend.prec_elem;
      local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_128.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_128.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_128.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_128.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_128.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
      local_128.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
      local_128.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
      local_128.m_backend.exp = (feastol->m_backend).exp;
      local_128.m_backend.neg = (feastol->m_backend).neg;
      local_128.m_backend.fpclass = (feastol->m_backend).fpclass;
      local_128.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_88,&local_d8,&local_128,in_R8);
      local_238.m_backend.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
      local_238.m_backend.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
      local_238.m_backend.data._M_elems._56_5_ = result.m_backend.data._M_elems._56_5_;
      local_238.m_backend.data._M_elems[0xf]._1_3_ = result.m_backend.data._M_elems[0xf]._1_3_;
      local_238.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
      local_238.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
      local_238.m_backend.data._M_elems[10] = result.m_backend.data._M_elems[10];
      local_238.m_backend.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
      local_238.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      local_238.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      local_238.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
      local_238.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
      local_238.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      local_238.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      local_238.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      local_238.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      local_238.m_backend.exp = result.m_backend.exp;
      local_238.m_backend.neg = result.m_backend.neg;
      local_238.m_backend.fpclass = result.m_backend.fpclass;
      local_238.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar8 = boost::multiprecision::operator>
                        (&local_238,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_178);
      if (tVar8) break;
    }
    else {
      pSVar4 = (local_1d8->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar6 = (pSVar4->infeasibilities).super_IdxSet.idx;
      iVar3 = (pSVar4->infeasibilities).super_IdxSet.num;
      (pSVar4->infeasibilities).super_IdxSet.num = iVar3 + -1;
      piVar6[uVar11] = piVar6[(long)iVar3 + -1];
      (pSVar4->isInfeasible).data[iVar2] = 0;
    }
    uVar10 = (ulong)((int)uVar10 - 1);
  } while( true );
  local_178.data._M_elems[0xf]._1_3_ = local_238.m_backend.data._M_elems[0xf]._1_3_;
  local_178.data._M_elems._56_5_ = local_238.m_backend.data._M_elems._56_5_;
  local_178.data._M_elems[0xc] = local_238.m_backend.data._M_elems[0xc];
  local_178.data._M_elems[0xd] = local_238.m_backend.data._M_elems[0xd];
  local_178.data._M_elems[8] = local_238.m_backend.data._M_elems[8];
  local_178.data._M_elems[9] = local_238.m_backend.data._M_elems[9];
  local_178.data._M_elems[10] = local_238.m_backend.data._M_elems[10];
  local_178.data._M_elems[0xb] = local_238.m_backend.data._M_elems[0xb];
  local_178.data._M_elems[4] = local_238.m_backend.data._M_elems[4];
  local_178.data._M_elems[5] = local_238.m_backend.data._M_elems[5];
  local_178.data._M_elems[6] = local_238.m_backend.data._M_elems[6];
  local_178.data._M_elems[7] = local_238.m_backend.data._M_elems[7];
  local_178.data._M_elems[0] = local_238.m_backend.data._M_elems[0];
  local_178.data._M_elems[1] = local_238.m_backend.data._M_elems[1];
  local_178.data._M_elems[2] = local_238.m_backend.data._M_elems[2];
  local_178.data._M_elems[3] = local_238.m_backend.data._M_elems[3];
  local_178.exp = local_238.m_backend.exp;
  local_178.neg = local_238.m_backend.neg;
  local_178.fpclass = local_238.m_backend.fpclass;
  local_178.prec_elem = local_238.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (local_1d0,&local_1e0[iVar2].m_backend);
  iVar9 = iVar2;
  goto LAB_00363676;
}

Assistant:

int SPxDevexPR<R>::selectLeaveSparse(R feastol)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   int bstI = -1;
   int idx = -1;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = fTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         if(x > best)
         {
            best = x;
            bstI = idx;
            last = cpen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         assert(this->thesolver->isInfeasible[idx] == this->VIOLATED
                || this->thesolver->isInfeasible[idx] == this->VIOLATED_AND_CHECKED);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   return bstI;
}